

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::TraverseSchema::changeRedefineGroup
          (TraverseSchema *this,DOMElement *redefineChildElem,XMLCh *redefineChildComponentName,
          XMLCh *redefineChildTypeName,int redefineNameCounter)

{
  short *psVar1;
  short *psVar2;
  XMLBuffer *this_00;
  XMLCh XVar3;
  XMLCh XVar4;
  XMLStringPool *pXVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  DOMNode *node;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar10;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  XMLSize_t count;
  int iVar13;
  undefined2 *puVar14;
  bool bVar15;
  
  node = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
  if (node == (DOMNode *)0x0) {
    iVar13 = 0;
  }
  else {
    this_00 = &this->fBuffer;
    iVar13 = 0;
    do {
      iVar6 = (*node->_vptr_DOMNode[0x18])(node);
      pXVar9 = (XMLCh *)CONCAT44(extraout_var,iVar6);
      if (pXVar9 != L"annotation") {
        pXVar11 = L"annotation";
        if (pXVar9 == (XMLCh *)0x0) {
LAB_0033f1e0:
          if (*pXVar11 == L'\0') goto LAB_0033f4a5;
        }
        else {
          pXVar11 = L"annotation";
          pXVar12 = pXVar9;
          do {
            XVar3 = *pXVar12;
            if (XVar3 == L'\0') goto LAB_0033f1e0;
            pXVar12 = pXVar12 + 1;
            XVar4 = *pXVar11;
            pXVar11 = pXVar11 + 1;
          } while (XVar3 == XVar4);
        }
        if (pXVar9 == redefineChildComponentName) {
LAB_0033f24d:
          pXVar9 = getElementAttValue(this,(DOMElement *)node,L"ref",QName);
          if ((pXVar9 != (XMLCh *)0x0) && (*pXVar9 != L'\0')) {
            iVar6 = XMLString::indexOf(pXVar9,L':');
            pXVar11 = L"";
            if (1 < iVar6 + 1U) {
              (this->fBuffer).fIndex = 0;
              XMLBuffer::append(this_00,pXVar9,(long)iVar6);
              pXVar5 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              uVar7 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
              iVar6 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar7);
              pXVar11 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
            }
            iVar6 = XMLString::indexOf(pXVar9,L':');
            lVar10 = 0;
            do {
              psVar1 = (short *)((long)pXVar9 + lVar10);
              lVar10 = lVar10 + 2;
            } while (*psVar1 != 0);
            count = (lVar10 >> 1) - 1;
            puVar14 = &XMLUni::fgZeroLenString;
            if (count != (long)(iVar6 + 1)) {
              if (iVar6 == -1) {
                this_00->fIndex = 0;
                pXVar12 = pXVar9;
              }
              else {
                count = count + ~(long)iVar6;
                this_00->fIndex = 0;
                pXVar12 = pXVar9 + (long)iVar6 + 1;
              }
              XMLBuffer::append(this_00,pXVar12,count);
              pXVar5 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              uVar7 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
              iVar6 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar7);
              puVar14 = (undefined2 *)CONCAT44(extraout_var_01,iVar6);
            }
            pXVar11 = resolvePrefixToURI(this,(DOMElement *)node,pXVar11);
            iVar6 = this->fTargetNSURI;
            iVar8 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                              (this->fURIStringPool,pXVar11);
            if (iVar6 == iVar8) {
              iVar6 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                                (this->fStringPool,puVar14);
              iVar8 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                                (this->fStringPool,redefineChildTypeName);
              if (iVar6 == iVar8) {
                this_00->fIndex = 0;
                if (*pXVar9 != L'\0') {
                  XMLBuffer::append(this_00,pXVar9);
                }
                iVar6 = redefineNameCounter;
                if (0 < redefineNameCounter) {
                  do {
                    XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                }
                (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
                (*node->_vptr_DOMNode[0x2c])(node,&SchemaSymbols::fgATT_REF);
                iVar13 = iVar13 + 1;
                if (redefineChildComponentName == L"group") {
LAB_0033f4c4:
                  pXVar9 = getElementAttValue(this,(DOMElement *)node,
                                              (XMLCh *)SchemaSymbols::fgATT_MINOCCURS,Decimal);
                  pXVar11 = getElementAttValue(this,(DOMElement *)node,
                                               (XMLCh *)SchemaSymbols::fgATT_MAXOCCURS,Decimal);
                  if (((pXVar11 == (XMLCh *)0x0) || (pXVar11 == L"1")) || (*pXVar11 == L'\0')) {
LAB_0033f52d:
                    if (((pXVar9 == (XMLCh *)0x0) || (pXVar9 == L"1")) || (*pXVar9 == L'\0'))
                    goto LAB_0033f4a5;
                    lVar10 = 0;
                    do {
                      psVar1 = (short *)((long)pXVar9 + lVar10);
                      if (*psVar1 == 0) {
                        if (*(short *)((long)&fgValueOne + lVar10) == 0) goto LAB_0033f4a5;
                        break;
                      }
                      psVar2 = (short *)((long)&fgValueOne + lVar10);
                      lVar10 = lVar10 + 2;
                    } while (*psVar1 == *psVar2);
                  }
                  else {
                    lVar10 = 0;
                    do {
                      psVar1 = (short *)((long)pXVar11 + lVar10);
                      if (*psVar1 == 0) {
                        if (*(short *)((long)&fgValueOne + lVar10) == 0) goto LAB_0033f52d;
                        break;
                      }
                      psVar2 = (short *)((long)&fgValueOne + lVar10);
                      lVar10 = lVar10 + 2;
                    } while (*psVar1 == *psVar2);
                  }
                  reportSchemaError(this,(DOMElement *)node,
                                    L"http://apache.org/xml/messages/XMLErrors",0x7c,
                                    redefineChildTypeName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                }
                else {
                  pXVar9 = L"group";
                  if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_0033f4be:
                    if (*pXVar9 == L'\0') goto LAB_0033f4c4;
                  }
                  else {
                    pXVar9 = L"group";
                    pXVar11 = redefineChildComponentName;
                    do {
                      XVar3 = *pXVar11;
                      if (XVar3 == L'\0') goto LAB_0033f4be;
                      pXVar11 = pXVar11 + 1;
                      XVar4 = *pXVar9;
                      pXVar9 = pXVar9 + 1;
                    } while (XVar3 == XVar4);
                  }
                }
              }
            }
          }
        }
        else {
          pXVar11 = redefineChildComponentName;
          if ((redefineChildComponentName == (XMLCh *)0x0) || (pXVar9 == (XMLCh *)0x0)) {
            if (pXVar9 == (XMLCh *)0x0) {
              if (redefineChildComponentName == (XMLCh *)0x0) goto LAB_0033f24d;
LAB_0033f23e:
              bVar15 = *pXVar11 == L'\0';
            }
            else {
              bVar15 = *pXVar9 == L'\0';
              if ((redefineChildComponentName != (XMLCh *)0x0) && (*pXVar9 == L'\0'))
              goto LAB_0033f23e;
            }
            if (bVar15) goto LAB_0033f24d;
          }
          else {
            do {
              XVar3 = *pXVar9;
              if (XVar3 == L'\0') goto LAB_0033f23e;
              pXVar9 = pXVar9 + 1;
              XVar4 = *pXVar11;
              pXVar11 = pXVar11 + 1;
            } while (XVar3 == XVar4);
          }
          iVar6 = changeRedefineGroup(this,(DOMElement *)node,redefineChildComponentName,
                                      redefineChildTypeName,redefineNameCounter);
          iVar13 = iVar13 + iVar6;
        }
      }
LAB_0033f4a5:
      node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
    } while (node != (DOMNode *)0x0);
  }
  return iVar13;
}

Assistant:

int TraverseSchema::changeRedefineGroup(const DOMElement* const redefineChildElem,
                                        const XMLCh* const redefineChildComponentName,
                                        const XMLCh* const redefineChildTypeName,
                                        const int redefineNameCounter) {
    int result = 0;
    DOMElement* child = XUtil::getFirstChildElement(redefineChildElem);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }

        if (!XMLString::equals(name, redefineChildComponentName)) {
            result += changeRedefineGroup(child, redefineChildComponentName, redefineChildTypeName, redefineNameCounter);
        } else {
            const XMLCh* refName = getElementAttValue(child, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);

            if (refName && *refName) {

                const XMLCh* prefix = getPrefix(refName);
                const XMLCh* localPart = getLocalPart(refName);
                const XMLCh* uriStr = resolvePrefixToURI(child, prefix);

                if (fTargetNSURI == (int) fURIStringPool->addOrFind(uriStr)
                    && fStringPool->addOrFind(localPart) == fStringPool->addOrFind(redefineChildTypeName)) {

                    // now we have to do the renaming...
                    getRedefineNewTypeName(refName, redefineNameCounter, fBuffer);
                    child->setAttribute(SchemaSymbols::fgATT_REF, fBuffer.getRawBuffer());
                    result++;

                    if(XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_GROUP)) {

                        const XMLCh* minOccurs = getElementAttValue(child, SchemaSymbols::fgATT_MINOCCURS, DatatypeValidator::Decimal);
                        const XMLCh* maxOccurs = getElementAttValue(child, SchemaSymbols::fgATT_MAXOCCURS, DatatypeValidator::Decimal);

                        if (((maxOccurs && *maxOccurs) && !XMLString::equals(maxOccurs, fgValueOne))
                            || ((minOccurs && *minOccurs) && !XMLString::equals(minOccurs, fgValueOne))) {
                            reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidGroupMinMax, redefineChildTypeName);
                        }
                    }
                }
            } // if ref was null some other stage of processing will flag the error
        }
    }

    return result;
}